

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.h
# Opt level: O0

Edge * __thiscall
S2Polyline::Shape::chain_edge(Edge *__return_storage_ptr__,Shape *this,int i,int j)

{
  ostream *poVar1;
  S2Point *_v0;
  S2Point *_v1;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  int local_18;
  int local_14;
  int j_local;
  int i_local;
  Shape *this_local;
  
  local_18 = j;
  local_14 = i;
  _j_local = this;
  if (i == 0) {
    _v0 = vertex(this->polyline_,j);
    _v1 = vertex(this->polyline_,local_18 + 1);
    S2Shape::Edge::Edge(__return_storage_ptr__,_v0,_v1);
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.h"
             ,0x13f,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_30);
  poVar1 = std::operator<<(poVar1,"Check failed: (i) == (0) ");
  S2LogMessageVoidify::operator&(&local_19,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

Edge chain_edge(int i, int j) const final {
      S2_DCHECK_EQ(i, 0);
      return Edge(polyline_->vertex(j), polyline_->vertex(j + 1));
    }